

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
boost::exception_detail::
clone_impl<boost::exception_detail::error_info_injector<boost::condition_error>_>::clone_impl
          (clone_impl<boost::exception_detail::error_info_injector<boost::condition_error>_> *this,
          error_info_injector<boost::condition_error> *x)

{
  exception *in_RSI;
  undefined8 *in_RDI;
  error_info_injector<boost::condition_error> *in_stack_ffffffffffffffc8;
  error_info_injector<boost::condition_error> *in_stack_ffffffffffffffd0;
  exception *in_stack_ffffffffffffffe8;
  
  clone_base::clone_base((clone_base *)(in_RDI + 0xd));
  error_info_injector<boost::condition_error>::error_info_injector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *in_RDI = 0x3059b0;
  in_RDI[8] = 0x3059e8;
  in_RDI[0xd] = 0x305a20;
  copy_boost_exception(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

explicit
            clone_impl( T const & x ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }